

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_file.c
# Opt level: O2

int qc_dir_rename(char *dirname,char *newname)

{
  int iVar1;
  
  if (dirname == (char *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
            ,0x11a);
    __assert_fail("dirname",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                  ,0x11a,"int qc_dir_rename(const char *, const char *)");
  }
  if (newname != (char *)0x0) {
    iVar1 = rename(dirname,newname);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                 ,0x11f,"dir rename(%s to %s) failed",dirname,newname);
      iVar1 = -1;
    }
    return iVar1;
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
          ,0x11b);
  __assert_fail("newname",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0x11b,"int qc_dir_rename(const char *, const char *)");
}

Assistant:

int qc_dir_rename(const char *dirname, const char *newname)
{
    qc_assert(dirname);
    qc_assert(newname);

    if (0 != rename(dirname, newname))
    {
        qc_perror("dir rename(%s to %s) failed", dirname, newname);
        return -1;
    }

    return 0;
}